

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

bool __thiscall
Catch::Matchers::Floating::WithinUlpsMatcher::match(WithinUlpsMatcher *this,double *matchee)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  string local_50;
  ReusableStringStream local_30;
  SourceLineInfo local_18;
  
  if (this->m_type == Double) {
    dVar1 = *matchee;
    dVar2 = this->m_target;
    if (NAN(dVar1) || NAN(dVar2)) {
      return false;
    }
    if ((long)((ulong)dVar2 ^ (ulong)dVar1) < 0) {
      bVar3 = dVar1 == dVar2;
      goto LAB_0011dfb2;
    }
    uVar4 = (ulong)ABS((double)((long)dVar1 - (long)dVar2));
    uVar5 = (ulong)(ABS((double)((long)dVar1 - (long)dVar2)) - 9.223372036854776e+18);
  }
  else {
    if (this->m_type != Float) {
      ReusableStringStream::ReusableStringStream(&local_30);
      local_18.file =
           "/workspace/llm4binary/github/license_c_cmakelists/surge-synthesizer[P]tuning-library/libs/catch2/catch2.hpp"
      ;
      local_18.line = 0x2d4f;
      operator<<(local_30.m_oss,&local_18);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,": Internal Catch2 error: ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,"Unknown FloatingPointKind value",0x1f);
      std::__cxx11::stringbuf::str();
      throw_logic_error(&local_50);
    }
    fVar6 = (float)*matchee;
    fVar7 = (float)this->m_target;
    if (NAN(fVar6) || NAN(fVar7)) {
      return false;
    }
    if ((int)((uint)fVar7 ^ (uint)fVar6) < 0) {
      bVar3 = fVar6 == fVar7;
LAB_0011dfb2:
      return (bool)(-bVar3 & 1);
    }
    uVar4 = (ulong)ABS((float)((int)fVar6 - (int)fVar7));
    uVar5 = (ulong)(ABS((float)((int)fVar6 - (int)fVar7)) - 9.223372e+18);
  }
  return (uVar5 & (long)uVar4 >> 0x3f | uVar4) <= this->m_ulps;
}

Assistant:

bool WithinUlpsMatcher::match(double const& matchee) const {
        switch (m_type) {
        case FloatingPointKind::Float:
            return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
        case FloatingPointKind::Double:
            return almostEqualUlps<double>(matchee, m_target, m_ulps);
        default:
            CATCH_INTERNAL_ERROR( "Unknown FloatingPointKind value" );
        }
    }